

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
::select_variables(solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                   *this,rc_size *sizes,int bkmin,int bkmax)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int unaff_R15D;
  bool bVar8;
  bool bVar9;
  double dVar10;
  
  iVar5 = sizes->c_size;
  iVar3 = iVar5 + bkmin;
  if (bkmin == bkmax) {
    if (sizes->r_size < iVar3) {
      iVar3 = sizes->r_size;
    }
    iVar5 = iVar3 + -1;
  }
  else {
    iVar4 = bkmax + iVar5;
    if (sizes->r_size < bkmax + iVar5) {
      iVar4 = sizes->r_size;
    }
    bVar2 = iVar4 < iVar3;
    if (iVar3 <= iVar4) {
      unaff_R15D = iVar5 + -1 + bkmin;
      lVar7 = ((long)bkmin + (long)iVar5) * 0xc;
      lVar6 = (long)bkmin + (long)iVar5;
      do {
        fVar1 = *(float *)((long)&((this->R)._M_t.
                                   super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                                   .
                                   super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
                                  ._M_head_impl)->value + lVar7);
        bVar9 = fVar1 == 0.0;
        bVar8 = fVar1 < 0.0;
        if ((bVar9) && (!NAN(fVar1))) {
          dVar10 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (this->rng);
          bVar9 = dVar10 == 0.5;
          bVar8 = 0.5 < dVar10;
        }
        if (!bVar8 && !bVar9) break;
        bVar2 = iVar4 <= lVar6;
        unaff_R15D = unaff_R15D + 1;
        lVar7 = lVar7 + 0xc;
        lVar6 = lVar6 + 1;
      } while (iVar4 != unaff_R15D);
    }
    iVar5 = iVar4 + -1;
    if (!bVar2) {
      iVar5 = unaff_R15D;
    }
  }
  return iVar5;
}

Assistant:

int select_variables(const rc_size& sizes, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin + sizes.c_size, sizes.r_size) - 1;

        bkmin += sizes.c_size;
        bkmax = std::min(bkmax + sizes.c_size, sizes.r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }